

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawMaskedSingle(bool renew)

{
  drawseg_t *ds_00;
  int local_1c;
  drawseg_t *pdStack_18;
  int i;
  drawseg_t *ds;
  bool renew_local;
  
  for (local_1c = vsprcount; 0 < local_1c; local_1c = local_1c + -1) {
    if (*(int *)(*(long *)(spritesorter + (long)(local_1c + -1) * 8) + 0xb0) == CurrentPortalUniq) {
      R_DrawSprite(*(vissprite_t **)(spritesorter + (long)(local_1c + -1) * 8));
    }
  }
  if (renew) {
    fake3D = fake3D | 4;
  }
  pdStack_18 = ds_p;
  ds_00 = pdStack_18;
  while (pdStack_18 = ds_00, ds_00 = pdStack_18 + -1, firstdrawseg < pdStack_18) {
    if (((pdStack_18[-1].CurrentPortalUniq == CurrentPortalUniq) && (pdStack_18[-1].fake == 0)) &&
       ((pdStack_18[-1].maskedtexturecol != -1 || (pdStack_18[-1].bFogBoundary != '\0')))) {
      R_RenderMaskedSegRange(ds_00,(int)pdStack_18[-1].x1,(int)pdStack_18[-1].x2);
    }
  }
  return;
}

Assistant:

void R_DrawMaskedSingle (bool renew)
{
	drawseg_t *ds;
	int i;

#if 0
	R_SplitVisSprites ();
#endif

	for (i = vsprcount; i > 0; i--)
	{
		if (spritesorter[i-1]->CurrentPortalUniq != CurrentPortalUniq)
			continue; // probably another time
		R_DrawSprite (spritesorter[i-1]);
	}

	// render any remaining masked mid textures

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	if (renew)
	{
		fake3D |= FAKE3D_REFRESHCLIP;
	}
	for (ds = ds_p; ds-- > firstdrawseg; )	// new -- killough
	{
		// [ZZ] the same as above
		if (ds->CurrentPortalUniq != CurrentPortalUniq)
			continue;
		// kg3D - no fake segs
		if (ds->fake) continue;
		if (ds->maskedtexturecol != -1 || ds->bFogBoundary)
		{
			R_RenderMaskedSegRange (ds, ds->x1, ds->x2);
		}
	}
}